

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToXml.cpp
# Opt level: O0

bool parseCommandLine(CommandLine *cmdLine,int argc,char **argv)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  size_type sVar3;
  ValueType *pVVar4;
  const_reference pvVar5;
  undefined1 local_88 [8];
  CommandLine opts;
  Parser parser;
  char **argv_local;
  int argc_local;
  CommandLine *cmdLine_local;
  
  de::cmdline::detail::Parser::Parser
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  de::cmdline::detail::CommandLine::CommandLine((CommandLine *)local_88);
  opt::registerOptions
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = de::cmdline::detail::Parser::parse
                    ((Parser *)
                     &opts.m_args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,argc + -1,argv + 1,
                     (CommandLine *)local_88,(ostream *)&std::cerr);
  if (bVar1) {
    pvVar2 = de::cmdline::detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_88);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar2);
    if (sVar3 == 2) {
      pVVar4 = de::cmdline::detail::CommandLine::getOption<opt::OutMode>((CommandLine *)local_88);
      cmdLine->outputMode = *pVVar4;
      pvVar2 = de::cmdline::detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_88);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,0);
      std::__cxx11::string::operator=((string *)cmdLine,(string *)pvVar5);
      pvVar2 = de::cmdline::detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_88);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,1);
      std::__cxx11::string::operator=((string *)&cmdLine->outputPath,(string *)pvVar5);
      cmdLine_local._7_1_ = true;
      goto LAB_0013fd16;
    }
  }
  printf("%s: [options] [testlog] [destination path]\n",*argv);
  de::cmdline::detail::Parser::help
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cout);
  cmdLine_local._7_1_ = false;
LAB_0013fd16:
  de::cmdline::detail::CommandLine::~CommandLine((CommandLine *)local_88);
  de::cmdline::detail::Parser::~Parser
            ((Parser *)
             &opts.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return cmdLine_local._7_1_;
}

Assistant:

static bool parseCommandLine (CommandLine& cmdLine, int argc, const char* const* argv)
{
	de::cmdline::Parser			parser;
	de::cmdline::CommandLine	opts;

	opt::registerOptions(parser);

	if (!parser.parse(argc-1, argv+1, &opts, std::cerr) ||
		opts.getArgs().size() != 2)
	{
		printf("%s: [options] [testlog] [destination path]\n", argv[0]);
		parser.help(std::cout);
		return false;
	}

	cmdLine.outputMode		= opts.getOption<opt::OutMode>();
	cmdLine.batchResultFile	= opts.getArgs()[0];
	cmdLine.outputPath		= opts.getArgs()[1];

	return true;
}